

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::GetOwnPropertyNamesInfoAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *scriptContext;
  JsRTVarsArgumentAction_InternalUse<1UL> *pJVar4;
  Var instance;
  RecyclableObject *value;
  JavascriptArray *instance_00;
  undefined4 *puVar5;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)54>
                     (evt);
  instance = InflateVarInReplay(executeContext,pJVar4->VarArray[0]);
  if (instance != (Var)0x0) {
    BVar3 = Js::JavascriptOperators::IsObject(instance);
    if (BVar3 != 0) {
      value = Js::VarTo<Js::RecyclableObject>(instance);
      if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        instance = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
      instance_00 = Js::JavascriptOperators::GetOwnPropertyNames(instance,scriptContext);
      if (instance_00 != (JavascriptArray *)0x0) {
        BVar3 = Js::CrossSite::NeedMarshalVar(instance_00,scriptContext);
        if (BVar3 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTActionEvents.cpp"
                             ,0x280,"(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx))",
                             "res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar5 = 0;
        }
      }
      JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)54>
                (executeContext,evt,instance_00);
      return;
    }
  }
  return;
}

Assistant:

void GetOwnPropertyNamesInfoAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::GetOwnPropertyNamesInfoActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            Js::JavascriptArray* res = Js::JavascriptOperators::GetOwnPropertyNames(var, ctx);
            Assert(res == nullptr || !Js::CrossSite::NeedMarshalVar(res, ctx));

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::GetOwnPropertyNamesInfoActionTag>(executeContext, evt, res);
        }